

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::Matcher
          (Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this,
          Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *param_1)

{
  Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *param_1_local;
  Matcher<const_std::basic_string_view<char,_std::char_traits<char>_>_&> *this_local;
  
  internal::MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>::MatcherBase
            (&this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>
             ,&param_1->
               super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>);
  (this->super_MatcherBase<const_std::basic_string_view<char,_std::char_traits<char>_>_&>).
  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__Matcher_029a1af0;
  return;
}

Assistant:

class GTEST_API_ Matcher<const internal::StringView&>
    : public internal::MatcherBase<const internal::StringView&> {
 public:
  Matcher() = default;

  explicit Matcher(const MatcherInterface<const internal::StringView&>* impl)
      : internal::MatcherBase<const internal::StringView&>(impl) {}

  template <typename M, typename = typename std::remove_reference<
                            M>::type::is_gtest_matcher>
  Matcher(M&& m)  // NOLINT
      : internal::MatcherBase<const internal::StringView&>(std::forward<M>(m)) {
  }

  // Allows the user to write str instead of Eq(str) sometimes, where
  // str is a std::string object.
  Matcher(const std::string& s);  // NOLINT

  // Allows the user to write "foo" instead of Eq("foo") sometimes.
  Matcher(const char* s);  // NOLINT

  // Allows the user to pass absl::string_views or std::string_views directly.
  Matcher(internal::StringView s);  // NOLINT
}